

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

CURLcode cf_hc_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  undefined4 *puVar1;
  Curl_cfilter *pCVar2;
  void *pvVar3;
  curl_trc_feat *pcVar4;
  byte bVar5;
  CURLcode CVar6;
  timediff_t tVar7;
  CURLcode *pCVar8;
  ulong uVar9;
  char *fmt;
  CURLcode CVar10;
  Curl_cfilter *pCVar11;
  cf_hc_baller *winner;
  curltime cVar12;
  curltime newer;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  puVar1 = (undefined4 *)cf->ctx;
  *done = false;
  cVar12 = Curl_now();
  CVar10 = CURLE_OK;
  CVar6 = CURLE_OK;
  switch(*puVar1) {
  case 0:
    break;
  case 1:
    goto switchD_0011461b_caseD_1;
  case 2:
    cf->field_0x24 = cf->field_0x24 | 1;
    *done = true;
    CVar6 = CVar10;
    goto switchD_0011461b_default;
  case 3:
    CVar10 = puVar1[8];
    cf->field_0x24 = cf->field_0x24 & 0xfe;
    goto LAB_0011490f;
  default:
    goto switchD_0011461b_default;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"connect, init");
  }
  *(time_t *)(puVar1 + 4) = cVar12.tv_sec;
  puVar1[6] = cVar12.tv_usec;
  if ((*(byte *)(puVar1 + 0x15) & 1) == 0) {
    if ((*(byte *)(puVar1 + 0x21) & 1) != 0) {
      cf_hc_baller_init((cf_hc_baller *)(puVar1 + 0x16),cf,data,"h21",(uint)cf->conn->transport);
    }
  }
  else {
    cf_hc_baller_init((cf_hc_baller *)(puVar1 + 10),cf,data,"h3",5);
    if ((*(byte *)(puVar1 + 0x21) & 1) != 0) {
      Curl_expire(data,(ulong)(uint)puVar1[0x22],EXPIRE_ALPN_EYEBALLS);
    }
  }
  *puVar1 = 1;
switchD_0011461b_caseD_1:
  if ((((*(byte *)(puVar1 + 0x15) & 1) == 0) ||
      (pCVar11 = *(Curl_cfilter **)(puVar1 + 0xc), pCVar11 == (Curl_cfilter *)0x0)) ||
     (puVar1[0xe] != 0)) {
LAB_0011477e:
    pvVar3 = cf->ctx;
    if (((*(byte *)((long)pvVar3 + 0x84) & 1) != 0) && (*(long *)((long)pvVar3 + 0x60) == 0)) {
      if ((((*(byte *)((long)pvVar3 + 0x54) & 1) != 0) && (*(long *)((long)pvVar3 + 0x30) != 0)) &&
         (*(int *)((long)pvVar3 + 0x38) == 0)) {
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar12._0_12_,0);
        newer.tv_usec = SUB124(cVar12._0_12_,8);
        cVar12._12_4_ = 0;
        cVar12._0_12_ = *(undefined1 (*) [12])((long)pvVar3 + 0x10);
        tVar7 = Curl_timediff(newer,cVar12);
        uVar9 = (ulong)*(uint *)((long)pvVar3 + 0x8c);
        if (tVar7 < (long)uVar9) {
          if ((long)(ulong)*(uint *)((long)pvVar3 + 0x88) <= tVar7) {
            if (*(int *)((long)pvVar3 + 0x50) < 0) {
              (**(code **)(**(long **)((long)pvVar3 + 0x30) + 0x70))
                        (*(long **)((long)pvVar3 + 0x30),data,2,(long)pvVar3 + 0x50,0);
              if (*(int *)((long)pvVar3 + 0x50) < 0) {
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                   (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar4->log_level)) && (0 < cf->cft->log_level)))) {
                  uVar9 = (ulong)*(uint *)((long)pvVar3 + 0x88);
                  fmt = "soft timeout of %dms reached, h3 has not seen any data, starting h21";
                  goto LAB_00114a2b;
                }
                goto LAB_001147ac;
              }
              uVar9 = (ulong)*(uint *)((long)pvVar3 + 0x8c);
            }
            Curl_expire(data,uVar9 - tVar7,EXPIRE_ALPN_EYEBALLS);
          }
          goto LAB_001147cf;
        }
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)
             ) && (0 < cf->cft->log_level)))) {
          fmt = "hard timeout of %dms reached, starting h21";
LAB_00114a2b:
          Curl_trc_cf_infof(data,cf,fmt,uVar9);
        }
      }
LAB_001147ac:
      cf_hc_baller_init((cf_hc_baller *)(puVar1 + 0x16),cf,data,"h21",(uint)cf->conn->transport);
    }
LAB_001147cf:
    if ((((*(byte *)(puVar1 + 0x21) & 1) != 0) &&
        (pCVar11 = *(Curl_cfilter **)(puVar1 + 0x18), pCVar11 != (Curl_cfilter *)0x0)) &&
       (puVar1[0x1a] == 0)) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))
          ) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"connect, check h21");
        pCVar11 = *(Curl_cfilter **)(puVar1 + 0x18);
      }
      pCVar2 = cf->next;
      cf->next = pCVar11;
      CVar6 = Curl_conn_cf_connect(pCVar11,data,false,done);
      puVar1[0x1a] = CVar6;
      *(Curl_cfilter **)(puVar1 + 0x18) = cf->next;
      cf->next = pCVar2;
      if ((CVar6 == CURLE_OK) && (*done == true)) {
        winner = (cf_hc_baller *)(puVar1 + 0x16);
        goto LAB_00114870;
      }
    }
    bVar5 = *(byte *)(puVar1 + 0x15) & 1;
    if (((bVar5 == 0) || (puVar1[0xe] != 0)) &&
       (((*(byte *)(puVar1 + 0x21) & 1) == 0 || (puVar1[0x1a] != 0)))) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))
          ) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"connect, all failed");
        bVar5 = *(byte *)(puVar1 + 0x15) & 1;
      }
      pCVar8 = puVar1 + 0xe;
      if (bVar5 == 0) {
        pCVar8 = puVar1 + 0x1a;
      }
      CVar6 = *pCVar8;
      puVar1[8] = CVar6;
      *puVar1 = 3;
    }
    else {
LAB_0011490f:
      *done = false;
      CVar6 = CVar10;
    }
  }
  else {
    pCVar2 = cf->next;
    cf->next = pCVar11;
    CVar6 = Curl_conn_cf_connect(pCVar11,data,false,done);
    puVar1[0xe] = CVar6;
    *(Curl_cfilter **)(puVar1 + 0xc) = cf->next;
    cf->next = pCVar2;
    if ((CVar6 != CURLE_OK) || (*done != true)) goto LAB_0011477e;
    winner = (cf_hc_baller *)(puVar1 + 10);
LAB_00114870:
    baller_connected(cf,data,winner);
    CVar6 = CURLE_OK;
  }
switchD_0011461b_default:
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"connect -> %d, done=%d",(ulong)CVar6,(ulong)*done);
  }
  return CVar6;
}

Assistant:

static CURLcode cf_hc_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool blocking, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime now;
  CURLcode result = CURLE_OK;

  (void)blocking;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  now = Curl_now();
  switch(ctx->state) {
  case CF_HC_INIT:
    DEBUGASSERT(!ctx->h3_baller.cf);
    DEBUGASSERT(!ctx->h21_baller.cf);
    DEBUGASSERT(!cf->next);
    CURL_TRC_CF(data, cf, "connect, init");
    ctx->started = now;
    if(ctx->h3_baller.enabled) {
      cf_hc_baller_init(&ctx->h3_baller, cf, data, "h3", TRNSPRT_QUIC);
      if(ctx->h21_baller.enabled)
        Curl_expire(data, ctx->soft_eyeballs_timeout_ms, EXPIRE_ALPN_EYEBALLS);
    }
    else if(ctx->h21_baller.enabled)
      cf_hc_baller_init(&ctx->h21_baller, cf, data, "h21",
                       cf->conn->transport);
    ctx->state = CF_HC_CONNECT;
    FALLTHROUGH();

  case CF_HC_CONNECT:
    if(cf_hc_baller_is_active(&ctx->h3_baller)) {
      result = cf_hc_baller_connect(&ctx->h3_baller, cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->h3_baller);
        goto out;
      }
    }

    if(time_to_start_h21(cf, data, now)) {
      cf_hc_baller_init(&ctx->h21_baller, cf, data, "h21",
                        cf->conn->transport);
    }

    if(cf_hc_baller_is_active(&ctx->h21_baller)) {
      CURL_TRC_CF(data, cf, "connect, check h21");
      result = cf_hc_baller_connect(&ctx->h21_baller, cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->h21_baller);
        goto out;
      }
    }

    if((!ctx->h3_baller.enabled || ctx->h3_baller.result) &&
       (!ctx->h21_baller.enabled || ctx->h21_baller.result)) {
      /* both failed or disabled. we give up */
      CURL_TRC_CF(data, cf, "connect, all failed");
      result = ctx->result = ctx->h3_baller.enabled?
                              ctx->h3_baller.result : ctx->h21_baller.result;
      ctx->state = CF_HC_FAILURE;
      goto out;
    }
    result = CURLE_OK;
    *done = FALSE;
    break;

  case CF_HC_FAILURE:
    result = ctx->result;
    cf->connected = FALSE;
    *done = FALSE;
    break;

  case CF_HC_SUCCESS:
    result = CURLE_OK;
    cf->connected = TRUE;
    *done = TRUE;
    break;
  }

out:
  CURL_TRC_CF(data, cf, "connect -> %d, done=%d", result, *done);
  return result;
}